

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

void affect_remove(CHAR_DATA *ch,AFFECT_DATA *paf)

{
  string_view fmt;
  string_view fmt_00;
  CHAR_DATA *in_RSI;
  char *in_RDI;
  AFFECT_DATA *prev;
  long vector [2];
  int where;
  long *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  CHAR_DATA *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  AFFECT_DATA *in_stack_ffffffffffffffd8;
  CHAR_DATA *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  if (*(long *)(in_RDI + 0x88) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffc0,
               (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    fmt_00._M_str = in_RDI;
    fmt_00._M_len = (size_t)in_RSI;
    CLogger::Warn<char*&>
              ((CLogger *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),fmt_00,
               (char **)in_stack_ffffffffffffffe0);
  }
  else {
    if (in_RSI->last_fight_name != (char *)0x0) {
      (*(code *)in_RSI->last_fight_name)(in_RDI,in_RSI);
    }
    affect_modify(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                  (bool)in_stack_ffffffffffffffd7);
    copy_vector((long *)&stack0xffffffffffffffd8,(long *)&in_RSI->reply);
    if (in_RSI == *(CHAR_DATA **)(in_RDI + 0x88)) {
      *(CHAR_DATA **)(in_RDI + 0x88) = in_RSI->next;
    }
    else {
      for (in_stack_ffffffffffffffc0 = *(CHAR_DATA **)(in_RDI + 0x88);
          in_stack_ffffffffffffffc0 != (CHAR_DATA *)0x0;
          in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0->next) {
        if (in_stack_ffffffffffffffc0->next == in_RSI) {
          in_stack_ffffffffffffffc0->next = in_RSI->next;
          break;
        }
      }
      if (in_stack_ffffffffffffffc0 == (CHAR_DATA *)0x0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)0x0,
                   (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        fmt._M_str = (char *)in_stack_ffffffffffffffe0;
        fmt._M_len = (size_t)in_stack_ffffffffffffffd8;
        CLogger::Warn<>((CLogger *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),fmt
                       );
        return;
      }
    }
    free_affect((AFFECT_DATA *)0x5f8379);
    affect_check(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void affect_remove(CHAR_DATA *ch, AFFECT_DATA *paf)
{
	int where;
	long vector[MAX_BITVECTOR];

	if (ch->affected == nullptr)
	{
		RS.Logger.Warn("Affect_remove: no affect on {}.", ch->name);
		return;
	}

	if (paf->end_fun != nullptr)
		(*paf->end_fun)(ch, paf);

	affect_modify(ch, paf, false);
	where = paf->where;
	copy_vector(vector, paf->bitvector);

	if (paf == ch->affected)
	{
		ch->affected = paf->next;
	}
	else
	{
		AFFECT_DATA *prev;

		for (prev = ch->affected; prev != nullptr; prev = prev->next)
		{
			if (prev->next == paf)
			{
				prev->next = paf->next;
				break;
			}
		}

		if (prev == nullptr)
		{
			RS.Logger.Warn("Affect_remove: cannot find paf.");
			return;
		}
	}

	free_affect(paf);
	affect_check(ch, where, vector);
}